

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

double __thiscall
duckdb::Interpolator<false>::
Operation<unsigned_long,double,duckdb::QuantileComposed<duckdb::MadAccessor<double,double,double>,duckdb::QuantileIndirect<double>>>
          (Interpolator<false> *this,unsigned_long *v_t,Vector *result,
          QuantileComposed<duckdb::MadAccessor<double,_double,_double>,_duckdb::QuantileIndirect<double>_>
          *accessor)

{
  DataChunk *pDVar1;
  idx_t iVar2;
  MadAccessor<double,_double,_double> *pMVar3;
  CURSOR *pCVar4;
  long lVar5;
  double dVar6;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<double,_double,_double>,_duckdb::QuantileIndirect<double>_>_>_>
  __comp;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<double,_double,_double>,_duckdb::QuantileIndirect<double>_>_>_>
  __comp_00;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<double,_double,_double>,_duckdb::QuantileIndirect<double>_>_>_>
  __comp_01;
  bool bVar7;
  ulong uVar8;
  reference pvVar9;
  idx_t iVar10;
  ulong uVar11;
  InvalidInputException *pIVar12;
  idx_t iVar13;
  duckdb *pdVar14;
  idx_t iVar15;
  double result_1;
  string local_80;
  double local_60;
  MadAccessor<double,_double,_double> *local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  bVar7 = this->desc;
  iVar13 = this->CRN;
  iVar15 = this->FRN;
  iVar2 = this->begin;
  iVar10 = this->end;
  local_80._M_dataplus._M_p = (pointer)accessor;
  local_80._M_string_length = (size_type)accessor;
  local_80.field_2._M_local_buf[0] = bVar7;
  if (iVar13 == iVar15) {
    if (iVar13 != iVar10 && iVar2 != iVar10) {
      uVar8 = (long)(iVar10 * 8 + iVar2 * -8) >> 3;
      lVar5 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      __comp._M_comp._17_7_ = local_80.field_2._M_allocated_capacity._1_7_;
      __comp._M_comp.desc = bVar7;
      __comp._M_comp.accessor_r = accessor;
      __comp._M_comp.accessor_l = accessor;
      ::std::
      __introselect<unsigned_long*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<double,double,double>,duckdb::QuantileIndirect<double>>>>>
                (v_t + iVar2,v_t + iVar13,v_t + iVar10,(ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,
                 __comp);
      iVar13 = this->FRN;
    }
    pMVar3 = accessor->outer;
    pCVar4 = accessor->inner->data;
    uVar8 = v_t[iVar13];
    if (((pCVar4->scan).next_row_index <= uVar8) ||
       (uVar11 = (pCVar4->scan).current_row_index, uVar8 < uVar11)) {
      pDVar1 = &pCVar4->page;
      ColumnDataCollection::Seek(pCVar4->inputs,uVar8,&pCVar4->scan,pDVar1);
      pvVar9 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      pCVar4->data = (double *)pvVar9->data;
      pvVar9 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      FlatVector::VerifyFlatVector(pvVar9);
      pCVar4->validity = &pvVar9->validity;
      uVar11 = (pCVar4->scan).current_row_index;
    }
    local_58 = (MadAccessor<double,_double,_double> *)
               ABS(pCVar4->data[(uint)((int)uVar8 - (int)uVar11)] - *pMVar3->median);
    uStack_50 = 0;
    pdVar14 = (duckdb *)0x0;
    bVar7 = TryCast::Operation<double,double>((double)local_58,&local_60,false);
    if (!bVar7) {
      pIVar12 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<double,double>(&local_80,pdVar14,(double)local_58);
      InvalidInputException::InvalidInputException(pIVar12,&local_80);
      __cxa_throw(pIVar12,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    if (iVar15 != iVar10 && iVar2 != iVar10) {
      uVar8 = (long)(iVar10 * 8 + iVar2 * -8) >> 3;
      lVar5 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      __comp_00._M_comp._17_7_ = local_80.field_2._M_allocated_capacity._1_7_;
      __comp_00._M_comp.desc = bVar7;
      __comp_00._M_comp.accessor_r = accessor;
      __comp_00._M_comp.accessor_l = accessor;
      ::std::
      __introselect<unsigned_long*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<double,double,double>,duckdb::QuantileIndirect<double>>>>>
                (v_t + iVar2,v_t + iVar15,v_t + iVar10,(ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_00);
      iVar15 = this->FRN;
      iVar13 = this->CRN;
      iVar10 = this->end;
    }
    local_80._M_dataplus._M_p = (pointer)accessor;
    local_80._M_string_length = (size_type)accessor;
    local_80.field_2._M_local_buf[0] = bVar7;
    if (iVar13 != iVar10 && iVar15 != iVar10) {
      uVar8 = (long)(iVar10 * 8 + iVar15 * -8) >> 3;
      lVar5 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      __comp_01._M_comp._17_7_ = local_80.field_2._M_allocated_capacity._1_7_;
      __comp_01._M_comp.desc = bVar7;
      __comp_01._M_comp.accessor_r = accessor;
      __comp_01._M_comp.accessor_l = accessor;
      ::std::
      __introselect<unsigned_long*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<double,double,double>,duckdb::QuantileIndirect<double>>>>>
                (v_t + iVar15,v_t + iVar13,v_t + iVar10,(ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_01);
      iVar15 = this->FRN;
    }
    local_58 = accessor->outer;
    pCVar4 = accessor->inner->data;
    uVar8 = v_t[iVar15];
    if (((pCVar4->scan).next_row_index <= uVar8) ||
       (uVar11 = (pCVar4->scan).current_row_index, uVar8 < uVar11)) {
      pDVar1 = &pCVar4->page;
      ColumnDataCollection::Seek(pCVar4->inputs,uVar8,&pCVar4->scan,pDVar1);
      pvVar9 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      pCVar4->data = (double *)pvVar9->data;
      pvVar9 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      FlatVector::VerifyFlatVector(pvVar9);
      pCVar4->validity = &pvVar9->validity;
      uVar11 = (pCVar4->scan).current_row_index;
    }
    local_58 = (MadAccessor<double,_double,_double> *)
               ABS(pCVar4->data[(uint)((int)uVar8 - (int)uVar11)] - *local_58->median);
    uStack_50 = 0;
    pdVar14 = (duckdb *)0x0;
    bVar7 = TryCast::Operation<double,double>((double)local_58,&local_60,false);
    if (!bVar7) {
      pIVar12 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<double,double>(&local_80,pdVar14,(double)local_58);
      InvalidInputException::InvalidInputException(pIVar12,&local_80);
      __cxa_throw(pIVar12,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_58 = (MadAccessor<double,_double,_double> *)local_60;
    pMVar3 = accessor->outer;
    pCVar4 = accessor->inner->data;
    uVar8 = v_t[this->CRN];
    uVar11 = (pCVar4->scan).current_row_index;
    if ((pCVar4->scan).next_row_index <= uVar8 || uVar8 < uVar11) {
      pDVar1 = &pCVar4->page;
      ColumnDataCollection::Seek(pCVar4->inputs,uVar8,&pCVar4->scan,pDVar1);
      pvVar9 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      pCVar4->data = (double *)pvVar9->data;
      pvVar9 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      FlatVector::VerifyFlatVector(pvVar9);
      pCVar4->validity = &pvVar9->validity;
      uVar11 = (pCVar4->scan).current_row_index;
    }
    local_48 = ABS(pCVar4->data[(uint)((int)uVar8 - (int)uVar11)] - *pMVar3->median);
    uStack_40 = 0;
    pdVar14 = (duckdb *)0x0;
    bVar7 = TryCast::Operation<double,double>(local_48,&local_60,false);
    if (!bVar7) {
      pIVar12 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<double,double>(&local_80,pdVar14,local_48);
      InvalidInputException::InvalidInputException(pIVar12,&local_80);
      __cxa_throw(pIVar12,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    dVar6 = this->RN -
            (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0));
    local_60 = dVar6 * local_60 + (double)local_58 * (1.0 - dVar6);
  }
  return local_60;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		if (CRN == FRN) {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
		} else {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			std::nth_element(v_t + FRN, v_t + CRN, v_t + end, comp);
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[CRN]), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}